

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

Status cmSystemTools::CreateSymlink(string *origName,string *newName)

{
  pointer pcVar1;
  size_type sVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  Status status;
  Status local_a0;
  string local_98;
  string local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  size_type local_28;
  pointer local_20;
  
  local_a0 = CreateSymlinkQuietly(origName,newName);
  if (local_a0.Kind_ != Success) {
    pcVar1 = (newName->_M_dataplus)._M_p;
    sVar2 = newName->_M_string_length;
    cmsys::Status::GetString_abi_cxx11_(&local_78,&local_a0);
    local_58._M_len = 0x20;
    local_58._M_str = "failed to create symbolic link \'";
    local_38 = 3;
    local_30 = "\': ";
    local_28 = local_78._M_string_length;
    local_20 = local_78._M_dataplus._M_p;
    views._M_len = 4;
    views._M_array = &local_58;
    local_48 = sVar2;
    local_40 = pcVar1;
    cmCatViews_abi_cxx11_(&local_98,views);
    Error(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return local_a0;
}

Assistant:

cmsys::Status cmSystemTools::CreateSymlink(std::string const& origName,
                                           std::string const& newName)
{
  cmsys::Status status =
    cmSystemTools::CreateSymlinkQuietly(origName, newName);
  if (!status) {
    cmSystemTools::Error(cmStrCat("failed to create symbolic link '", newName,
                                  "': ", status.GetString()));
  }
  return status;
}